

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwrEva.c
# Opt level: O3

int Rwr_NodeRewrite(Rwr_Man_t *p,Cut_Man_t *pManCut,Abc_Obj_t *pNode,int fUpdateLevel,int fUseZeros,
                   int fPlaceEnable)

{
  ushort uVar1;
  char *pcVar2;
  Abc_Ntk_t *pAVar3;
  int iVar4;
  int iVar5;
  void *pvVar6;
  void **ppvVar7;
  ulong uVar8;
  int *piVar9;
  Vec_Ptr_t *pVVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  Dec_Graph_t *pGraph;
  uint uVar17;
  uint uVar18;
  Rwr_Man_t *pRVar19;
  uint uVar20;
  Abc_Obj_t *pNode_00;
  uint *puVar21;
  timespec ts;
  int local_98;
  int local_94;
  timespec local_90;
  int local_80;
  uint local_7c;
  uint local_78;
  int local_74;
  Abc_Obj_t *local_70;
  Rwr_Man_t *local_68;
  uint *local_60;
  Dec_Graph_t *local_58;
  int local_4c;
  long local_48;
  ulong local_40;
  long local_38;
  
  p->nNodesConsidered = p->nNodesConsidered + 1;
  local_4c = fUseZeros;
  if (fUpdateLevel == 0) {
    local_74 = 1000000000;
  }
  else {
    local_74 = Abc_ObjRequiredLevel(pNode);
  }
  local_68 = p;
  iVar4 = clock_gettime(3,&local_90);
  if (iVar4 < 0) {
    lVar14 = 1;
  }
  else {
    lVar14 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_90.tv_nsec),8);
    lVar14 = ((lVar14 >> 7) - (lVar14 >> 0x3f)) + local_90.tv_sec * -1000000;
  }
  pvVar6 = Abc_NodeGetCutsRecursive(pManCut,pNode,0,0);
  if (pvVar6 == (void *)0x0) {
    __assert_fail("pCut != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/rwr/rwrEva.c"
                  ,0x51,"int Rwr_NodeRewrite(Rwr_Man_t *, Cut_Man_t *, Abc_Obj_t *, int, int, int)")
    ;
  }
  iVar4 = clock_gettime(3,&local_90);
  pRVar19 = local_68;
  if (iVar4 < 0) {
    lVar15 = -1;
  }
  else {
    lVar15 = local_90.tv_nsec / 1000 + local_90.tv_sec * 1000000;
  }
  local_68->timeCut = local_68->timeCut + lVar15 + lVar14;
  iVar4 = clock_gettime(3,&local_90);
  if (iVar4 < 0) {
    local_48 = 1;
  }
  else {
    lVar14 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_90.tv_nsec),8);
    local_48 = ((lVar14 >> 7) - (lVar14 >> 0x3f)) + local_90.tv_sec * -1000000;
  }
  puVar21 = *(uint **)((long)pvVar6 + 0x10);
  local_40 = 0;
  if (puVar21 == (uint *)0x0) {
    iVar4 = -1;
  }
  else {
    local_80 = -1;
    local_78 = 0;
    local_94 = -1;
    local_70 = pNode;
    do {
      if (0x3fffffff < *puVar21) {
        uVar1 = *(ushort *)((long)puVar21 + (ulong)(*puVar21 >> 0x16 & 0x3c) + 0x18);
        pcVar2 = pRVar19->pPerms4[pRVar19->pPerms[uVar1]];
        uVar18 = (uint)pRVar19->pPhases[uVar1];
        pVVar10 = pRVar19->vFaninsCur;
        pVVar10->nSize = 0;
        uVar17 = *puVar21;
        uVar20 = uVar17 >> 0x1c;
        if (pVVar10->nCap < (int)uVar20) {
          local_7c = uVar18;
          if (pVVar10->pArray == (void **)0x0) {
            ppvVar7 = (void **)malloc((ulong)(uVar20 * 8));
          }
          else {
            ppvVar7 = (void **)realloc(pVVar10->pArray,(ulong)(uVar20 * 8));
          }
          pVVar10->pArray = ppvVar7;
          pVVar10->nCap = uVar20;
          uVar18 = local_7c;
        }
        pNode_00 = local_70;
        if (0xfffffff < uVar17) {
          uVar12 = 0;
          do {
            pVVar10->pArray[uVar12] = (void *)0x0;
            uVar12 = uVar12 + 1;
          } while (uVar20 != uVar12);
        }
        pVVar10->nSize = uVar20;
        uVar17 = *puVar21 >> 0x1c;
        uVar12 = (ulong)uVar17;
        uVar8 = 0;
        if (0xfffffff < *puVar21) {
          uVar8 = 0;
          do {
            uVar17 = (uint)uVar12;
            uVar20 = puVar21[(long)pcVar2[uVar8] + 6];
            if (((long)(int)uVar20 < 0) ||
               (pVVar10 = local_70->pNtk->vObjs, pVVar10->nSize <= (int)uVar20)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            pvVar6 = pVVar10->pArray[(int)uVar20];
            if (pvVar6 == (void *)0x0) break;
            if ((long)pRVar19->vFaninsCur->nSize <= (long)uVar8) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                            ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
            }
            pRVar19->vFaninsCur->pArray[uVar8] =
                 (void *)((ulong)pvVar6 ^ (ulong)((uVar18 >> ((uint)uVar8 & 0x1f) & 1) != 0));
            uVar8 = uVar8 + 1;
            uVar17 = *puVar21 >> 0x1c;
            uVar12 = (ulong)uVar17;
          } while (uVar8 < uVar12);
        }
        if ((uint)uVar8 == uVar17) {
          pRVar19->nCutsGood = pRVar19->nCutsGood + 1;
          lVar14 = (long)pRVar19->vFaninsCur->nSize;
          if (0 < lVar14) {
            lVar15 = 0;
            uVar17 = 0;
            do {
              uVar17 = uVar17 + (*(int *)(((ulong)pRVar19->vFaninsCur->pArray[lVar15] &
                                          0xfffffffffffffffe) + 0x2c) == 1);
              lVar15 = lVar15 + 1;
            } while (lVar14 != lVar15);
            if (2 < uVar17) goto LAB_004c4e17;
          }
          local_7c = uVar18;
          iVar4 = clock_gettime(3,&local_90);
          if (iVar4 < 0) {
            lVar14 = 1;
          }
          else {
            lVar14 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_90.tv_nsec),8);
            lVar14 = ((lVar14 >> 7) - (lVar14 >> 0x3f)) + local_90.tv_sec * -1000000;
          }
          lVar15 = (long)pRVar19->vFaninsCur->nSize;
          if (0 < lVar15) {
            ppvVar7 = pRVar19->vFaninsCur->pArray;
            lVar16 = 0;
            do {
              piVar9 = (int *)(((ulong)ppvVar7[lVar16] & 0xfffffffffffffffe) + 0x2c);
              *piVar9 = *piVar9 + 1;
              lVar16 = lVar16 + 1;
            } while (lVar15 != lVar16);
          }
          pAVar3 = pNode_00->pNtk;
          if ((pAVar3->vTravIds).pArray == (int *)0x0) {
            iVar4 = pAVar3->vObjs->nSize;
            uVar12 = (long)iVar4 + 500;
            iVar5 = (int)uVar12;
            if ((pAVar3->vTravIds).nCap < iVar5) {
              piVar9 = (int *)malloc(uVar12 * 4);
              (pAVar3->vTravIds).pArray = piVar9;
              if (piVar9 == (int *)0x0) {
                __assert_fail("p->pArray",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                              ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
              }
              (pAVar3->vTravIds).nCap = iVar5;
            }
            else {
              piVar9 = (int *)0x0;
            }
            if (-500 < iVar4) {
              memset(piVar9,0,(uVar12 & 0xffffffff) << 2);
            }
            (pAVar3->vTravIds).nSize = iVar5;
            pNode_00 = local_70;
          }
          iVar4 = pAVar3->nTravIds;
          pAVar3->nTravIds = iVar4 + 1;
          if (0x3ffffffe < iVar4) {
            __assert_fail("p->nTravIds < (1<<30)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                          ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
          }
          iVar4 = Abc_NodeMffcLabelAig(pNode_00);
          lVar15 = (long)pRVar19->vFaninsCur->nSize;
          if (0 < lVar15) {
            ppvVar7 = pRVar19->vFaninsCur->pArray;
            lVar16 = 0;
            do {
              piVar9 = (int *)(((ulong)ppvVar7[lVar16] & 0xfffffffffffffffe) + 0x2c);
              *piVar9 = *piVar9 + -1;
              lVar16 = lVar16 + 1;
            } while (lVar15 != lVar16);
          }
          iVar5 = clock_gettime(3,&local_90);
          if (iVar5 < 0) {
            lVar15 = -1;
          }
          else {
            lVar15 = local_90.tv_nsec / 1000 + local_90.tv_sec * 1000000;
          }
          pRVar19->timeMffc = pRVar19->timeMffc + lVar15 + lVar14;
          iVar5 = clock_gettime(3,&local_90);
          if (iVar5 < 0) {
            lVar14 = 1;
          }
          else {
            lVar14 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_90.tv_nsec),8);
            lVar14 = ((lVar14 >> 7) - (lVar14 >> 0x3f)) + local_90.tv_sec * -1000000;
          }
          if (pRVar19->vClasses->nSize <=
              (int)(uint)pRVar19->pMap
                         [(ushort)puVar21[(ulong)(*(byte *)((long)puVar21 + 3) & 0xf) + 6]]) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecVec.h"
                          ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
          }
          pVVar10 = pRVar19->vFaninsCur;
          pvVar6 = pRVar19->vClasses->pArray
                   [pRVar19->pMap[(ushort)puVar21[(ulong)(*(byte *)((long)puVar21 + 3) & 0xf) + 6]]]
          ;
          iVar5 = *(int *)((long)pvVar6 + 4);
          pRVar19->nSubgraphs = pRVar19->nSubgraphs + iVar5;
          local_60 = puVar21;
          local_38 = lVar14;
          if (iVar5 < 1) {
            local_98 = local_94;
            pGraph = (Dec_Graph_t *)0x0;
          }
          else {
            local_98 = -1;
            lVar14 = 0;
            local_58 = (Dec_Graph_t *)0x0;
            do {
              while( true ) {
                lVar15 = *(long *)(*(long *)((long)pvVar6 + 8) + lVar14 * 8);
                pGraph = *(Dec_Graph_t **)(lVar15 + 0x28);
                if (0 < pVVar10->nSize) {
                  lVar16 = 1;
                  lVar13 = 0;
                  do {
                    *(void **)(&pGraph->pNodes->eEdge0 + lVar16 * 2) = pVVar10->pArray[lVar13];
                    lVar13 = lVar13 + 1;
                    lVar16 = lVar16 + 3;
                  } while (lVar13 < pVVar10->nSize);
                }
                iVar5 = Dec_GraphToNetworkCount(local_70,pGraph,iVar4,local_74);
                if (iVar5 != -1) break;
LAB_004c4c37:
                lVar14 = lVar14 + 1;
                if (*(int *)((long)pvVar6 + 4) <= lVar14) {
                  pGraph = local_58;
                  if (local_98 == -1) {
                    pGraph = (Dec_Graph_t *)0x0;
                    local_98 = local_94;
                  }
                  goto LAB_004c4c8e;
                }
              }
              iVar11 = iVar4 - iVar5;
              if (iVar4 < iVar5) {
                __assert_fail("nNodesSaved >= nNodesAdded",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/rwr/rwrEva.c"
                              ,0x119,
                              "Dec_Graph_t *Rwr_CutEvaluate(Rwr_Man_t *, Abc_Obj_t *, Cut_Cut_t *, Vec_Ptr_t *, int, int, int *, int)"
                             );
              }
              if (iVar11 <= local_98) goto LAB_004c4c37;
              local_58 = pGraph;
              if (0 < iVar11) {
                *(uint *)(lVar15 + 8) =
                     CONCAT22((short)iVar11 + (short)((ulong)*(undefined8 *)(lVar15 + 8) >> 0x10),
                              (short)*(undefined8 *)(lVar15 + 8) + 1);
                *(short *)(lVar15 + 0xc) = *(short *)(lVar15 + 0xc) + (short)iVar5;
                local_98 = iVar11;
                goto LAB_004c4c37;
              }
              lVar14 = lVar14 + 1;
              local_98 = 0;
            } while (lVar14 < *(int *)((long)pvVar6 + 4));
          }
LAB_004c4c8e:
          iVar4 = clock_gettime(3,&local_90);
          pRVar19 = local_68;
          if (iVar4 < 0) {
            lVar14 = -1;
          }
          else {
            lVar14 = local_90.tv_nsec / 1000 + local_90.tv_sec * 1000000;
          }
          local_68->timeEval = local_68->timeEval + lVar14 + local_38;
          puVar21 = local_60;
          if ((pGraph == (Dec_Graph_t *)0x0) || (local_98 <= local_80)) {
            local_94 = local_98;
          }
          else {
            local_68->pGraph = pGraph;
            local_68->fCompl = local_7c >> 4 & 1;
            local_78 = (uint)(ushort)local_60[(ulong)(*(byte *)((long)local_60 + 3) & 0xf) + 6];
            local_68->vFanins->nSize = 0;
            pVVar10 = local_68->vFaninsCur;
            if (pVVar10->nSize < 1) {
              local_94 = local_98;
              local_80 = local_98;
            }
            else {
              lVar14 = 0;
              do {
                pvVar6 = pVVar10->pArray[lVar14];
                pVVar10 = pRVar19->vFanins;
                uVar17 = pVVar10->nSize;
                if (uVar17 == pVVar10->nCap) {
                  if ((int)uVar17 < 0x10) {
                    if (pVVar10->pArray == (void **)0x0) {
                      ppvVar7 = (void **)malloc(0x80);
                    }
                    else {
                      ppvVar7 = (void **)realloc(pVVar10->pArray,0x80);
                    }
                    pVVar10->pArray = ppvVar7;
                    pVVar10->nCap = 0x10;
                  }
                  else {
                    if (pVVar10->pArray == (void **)0x0) {
                      ppvVar7 = (void **)malloc((ulong)uVar17 << 4);
                    }
                    else {
                      ppvVar7 = (void **)realloc(pVVar10->pArray,(ulong)uVar17 << 4);
                    }
                    pVVar10->pArray = ppvVar7;
                    pVVar10->nCap = uVar17 * 2;
                  }
                }
                else {
                  ppvVar7 = pVVar10->pArray;
                }
                iVar4 = pVVar10->nSize;
                pVVar10->nSize = iVar4 + 1;
                ppvVar7[iVar4] = pvVar6;
                lVar14 = lVar14 + 1;
                pVVar10 = pRVar19->vFaninsCur;
              } while (lVar14 < pVVar10->nSize);
              local_94 = local_98;
              local_80 = local_98;
              puVar21 = local_60;
            }
          }
        }
        else {
          pRVar19->nCutsBad = pRVar19->nCutsBad + 1;
        }
      }
LAB_004c4e17:
      puVar21 = *(uint **)(puVar21 + 4);
    } while (puVar21 != (uint *)0x0);
    local_40 = (ulong)local_78;
    iVar4 = local_80;
  }
  iVar5 = clock_gettime(3,&local_90);
  if (iVar5 < 0) {
    lVar14 = -1;
  }
  else {
    lVar14 = local_90.tv_nsec / 1000 + local_90.tv_sec * 1000000;
  }
  pRVar19->timeRes = pRVar19->timeRes + lVar14 + local_48;
  if (iVar4 != -1) {
    pVVar10 = pRVar19->vFanins;
    if (0 < pVVar10->nSize) {
      lVar14 = 1;
      lVar15 = 0;
      do {
        *(void **)(*(long *)((long)pRVar19->pGraph + 0x10) + lVar14 * 8) = pVVar10->pArray[lVar15];
        lVar15 = lVar15 + 1;
        pVVar10 = pRVar19->vFanins;
        lVar14 = lVar14 + 3;
      } while (lVar15 < pVVar10->nSize);
    }
    pRVar19->nScores[pRVar19->pMap[local_40]] = pRVar19->nScores[pRVar19->pMap[local_40]] + 1;
    pRVar19->nNodesGained = pRVar19->nNodesGained + iVar4;
    if ((local_4c != 0) || (0 < iVar4)) {
      pRVar19->nNodesRewritten = pRVar19->nNodesRewritten + 1;
    }
  }
  return iVar4;
}

Assistant:

int Rwr_NodeRewrite( Rwr_Man_t * p, Cut_Man_t * pManCut, Abc_Obj_t * pNode, int fUpdateLevel, int fUseZeros, int fPlaceEnable )
{
    int fVeryVerbose = 0;
    Dec_Graph_t * pGraph;
    Cut_Cut_t * pCut;//, * pTemp;
    Abc_Obj_t * pFanin;
    unsigned uPhase;
    unsigned uTruthBest = 0; // Suppress "might be used uninitialized"
    unsigned uTruth;
    char * pPerm;
    int Required, nNodesSaved;
    int nNodesSaveCur = -1; // Suppress "might be used uninitialized"
    int i, GainCur = -1, GainBest = -1;
    abctime clk, clk2;//, Counter;

    p->nNodesConsidered++;
    // get the required times
    Required = fUpdateLevel? Abc_ObjRequiredLevel(pNode) : ABC_INFINITY;

    // get the node's cuts
clk = Abc_Clock();
    pCut = (Cut_Cut_t *)Abc_NodeGetCutsRecursive( pManCut, pNode, 0, 0 );
    assert( pCut != NULL );
p->timeCut += Abc_Clock() - clk;

//printf( " %d", Rwr_CutCountNumNodes(pNode, pCut) );
/*
    Counter = 0;
    for ( pTemp = pCut->pNext; pTemp; pTemp = pTemp->pNext )
        Counter++;
    printf( "%d ", Counter );
*/
    // go through the cuts
clk = Abc_Clock();
    for ( pCut = pCut->pNext; pCut; pCut = pCut->pNext )
    {
        // consider only 4-input cuts
        if ( pCut->nLeaves < 4 )
            continue;
//            Cut_CutPrint( pCut, 0 ), printf( "\n" );

        // get the fanin permutation
        uTruth = 0xFFFF & *Cut_CutReadTruth(pCut);
        pPerm = p->pPerms4[ (int)p->pPerms[uTruth] ];
        uPhase = p->pPhases[uTruth];
        // collect fanins with the corresponding permutation/phase
        Vec_PtrClear( p->vFaninsCur );
        Vec_PtrFill( p->vFaninsCur, (int)pCut->nLeaves, 0 );
        for ( i = 0; i < (int)pCut->nLeaves; i++ )
        {
            pFanin = Abc_NtkObj( pNode->pNtk, pCut->pLeaves[(int)pPerm[i]] );
            if ( pFanin == NULL )
                break;
            pFanin = Abc_ObjNotCond(pFanin, ((uPhase & (1<<i)) > 0) );
            Vec_PtrWriteEntry( p->vFaninsCur, i, pFanin );
        }
        if ( i != (int)pCut->nLeaves )
        {
            p->nCutsBad++;
            continue;
        }
        p->nCutsGood++;

        {
            int Counter = 0;
            Vec_PtrForEachEntry( Abc_Obj_t *, p->vFaninsCur, pFanin, i )
                if ( Abc_ObjFanoutNum(Abc_ObjRegular(pFanin)) == 1 )
                    Counter++;
            if ( Counter > 2 )
                continue;
        }

clk2 = Abc_Clock();
/*
        printf( "Considering: (" );
        Vec_PtrForEachEntry( Abc_Obj_t *, p->vFaninsCur, pFanin, i )
            printf( "%d ", Abc_ObjFanoutNum(Abc_ObjRegular(pFanin)) );
        printf( ")\n" );
*/
        // mark the fanin boundary 
        Vec_PtrForEachEntry( Abc_Obj_t *, p->vFaninsCur, pFanin, i )
            Abc_ObjRegular(pFanin)->vFanouts.nSize++;

        // label MFFC with current ID
        Abc_NtkIncrementTravId( pNode->pNtk );
        nNodesSaved = Abc_NodeMffcLabelAig( pNode );
        // unmark the fanin boundary
        Vec_PtrForEachEntry( Abc_Obj_t *, p->vFaninsCur, pFanin, i )
            Abc_ObjRegular(pFanin)->vFanouts.nSize--;
p->timeMffc += Abc_Clock() - clk2;

        // evaluate the cut
clk2 = Abc_Clock();
        pGraph = Rwr_CutEvaluate( p, pNode, pCut, p->vFaninsCur, nNodesSaved, Required, &GainCur, fPlaceEnable );
p->timeEval += Abc_Clock() - clk2;

        // check if the cut is better than the current best one
        if ( pGraph != NULL && GainBest < GainCur )
        {
            // save this form
            nNodesSaveCur = nNodesSaved;
            GainBest  = GainCur;
            p->pGraph  = pGraph;
            p->fCompl = ((uPhase & (1<<4)) > 0);
            uTruthBest = 0xFFFF & *Cut_CutReadTruth(pCut);
            // collect fanins in the
            Vec_PtrClear( p->vFanins );
            Vec_PtrForEachEntry( Abc_Obj_t *, p->vFaninsCur, pFanin, i )
                Vec_PtrPush( p->vFanins, pFanin );
        }
    }
p->timeRes += Abc_Clock() - clk;

    if ( GainBest == -1 )
        return -1;
/*
    if ( GainBest > 0 )
    {
        printf( "Class %d  ", p->pMap[uTruthBest] );
        printf( "Gain = %d. Node %d : ", GainBest, pNode->Id );
        Vec_PtrForEachEntry( Abc_Obj_t *, p->vFanins, pFanin, i )
            printf( "%d ", Abc_ObjRegular(pFanin)->Id );
        Dec_GraphPrint( stdout, p->pGraph, NULL, NULL );
        printf( "\n" );
    }
*/

//    printf( "%d", nNodesSaveCur - GainBest );
/*
    if ( GainBest > 0 )
    {
        if ( Rwr_CutIsBoolean( pNode, p->vFanins ) )
            printf( "b" );
        else
        {
            printf( "Node %d : ", pNode->Id );
            Vec_PtrForEachEntry( Abc_Obj_t *, p->vFanins, pFanin, i )
                printf( "%d ", Abc_ObjRegular(pFanin)->Id );
            printf( "a" );
        }
    }
*/
/*
    if ( GainBest > 0 )
        if ( p->fCompl )
            printf( "c" );
        else
            printf( "." );
*/

    // copy the leaves
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vFanins, pFanin, i )
        Dec_GraphNode((Dec_Graph_t *)p->pGraph, i)->pFunc = pFanin;
/*
    printf( "(" );
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vFanins, pFanin, i )
        printf( " %d", Abc_ObjRegular(pFanin)->vFanouts.nSize - 1 );
    printf( " )  " );
*/
//    printf( "%d ", Rwr_NodeGetDepth_rec( pNode, p->vFanins ) );

    p->nScores[p->pMap[uTruthBest]]++;
    p->nNodesGained += GainBest;
    if ( fUseZeros || GainBest > 0 )
    {
        p->nNodesRewritten++;
    }

    // report the progress
    if ( fVeryVerbose && GainBest > 0 )
    {
        printf( "Node %6s :   ", Abc_ObjName(pNode) );
        printf( "Fanins = %d. ", p->vFanins->nSize );
        printf( "Save = %d.  ", nNodesSaveCur );
        printf( "Add = %d.  ",  nNodesSaveCur-GainBest );
        printf( "GAIN = %d.  ", GainBest );
        printf( "Cone = %d.  ", p->pGraph? Dec_GraphNodeNum((Dec_Graph_t *)p->pGraph) : 0 );
        printf( "Class = %d.  ", p->pMap[uTruthBest] );
        printf( "\n" );
    }
    return GainBest;
}